

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadArgumentElimination.cpp
# Opt level: O0

void __thiscall wasm::DAE::~DAE(DAE *this)

{
  DAE *this_local;
  
  ~DAE(this);
  operator_delete(this,0x70);
  return;
}

Assistant:

bool invalidatesDWARF() override { return true; }